

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void dumb_it_set_resampling_quality(DUMB_IT_SIGRENDERER *sigrenderer,int quality)

{
  int quality_00;
  long lVar1;
  IT_PLAYING *pIVar2;
  IT_PLAYING *playing;
  long lVar3;
  
  if ((uint)quality < 8 && sigrenderer != (DUMB_IT_SIGRENDERER *)0x0) {
    sigrenderer->resampling_quality = quality;
    quality_00 = quality + -2;
    lVar3 = 0xa8;
    do {
      lVar1 = *(long *)(sigrenderer->channel[0].arpeggio_offsets + lVar3 + -0x50);
      if (lVar1 != 0) {
        *(int *)(lVar1 + 4) = quality;
        *(int *)(lVar1 + 0xe0) = quality;
        resampler_set_quality(*(void **)(lVar1 + 0x108),quality_00);
        resampler_set_quality(*(void **)(lVar1 + 0x110),quality_00);
      }
      lVar3 = lVar3 + 0xa0;
    } while (lVar3 != 0x28a8);
    lVar3 = 0;
    do {
      pIVar2 = sigrenderer->playing[lVar3];
      if (pIVar2 != (IT_PLAYING *)0x0) {
        pIVar2->resampling_quality = quality;
        (pIVar2->resampler).quality = quality;
        resampler_set_quality((pIVar2->resampler).fir_resampler[0],quality_00);
        resampler_set_quality((pIVar2->resampler).fir_resampler[1],quality_00);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xc0);
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_it_set_resampling_quality(DUMB_IT_SIGRENDERER * sigrenderer, int quality)
{
	if (sigrenderer && quality >= 0 && quality < DUMB_RQ_N_LEVELS)
	{
		int i;
		sigrenderer->resampling_quality = quality;
		for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
			if (sigrenderer->channel[i].playing)
			{
				IT_PLAYING * playing = sigrenderer->channel[i].playing;
				playing->resampling_quality = quality;
				playing->resampler.quality = quality;
				resampler_set_quality(playing->resampler.fir_resampler[0], quality - DUMB_RESAMPLER_BASE);
				resampler_set_quality(playing->resampler.fir_resampler[1], quality - DUMB_RESAMPLER_BASE);
			}
		}
		for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
			if (sigrenderer->playing[i]) {
				IT_PLAYING * playing = sigrenderer->playing[i];
				playing->resampling_quality = quality;
				playing->resampler.quality = quality;
				resampler_set_quality(playing->resampler.fir_resampler[0], quality - DUMB_RESAMPLER_BASE);
				resampler_set_quality(playing->resampler.fir_resampler[1], quality - DUMB_RESAMPLER_BASE);
			}
		}
	}
}